

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_print(HSQUIRRELVM v)

{
  SQPRINTFUNCTION p_Var1;
  SQChar *in_RAX;
  SQRESULT SVar2;
  SQInteger SVar3;
  SQChar *str;
  SQChar *local_18;
  
  local_18 = in_RAX;
  SVar2 = sq_tostring(v,2);
  SVar3 = -1;
  if (-1 < SVar2) {
    SVar2 = sq_getstring(v,-1,&local_18);
    if (-1 < SVar2) {
      p_Var1 = v->_sharedstate->_printfunc;
      if (p_Var1 == (SQPRINTFUNCTION)0x0) {
        SVar3 = 0;
      }
      else {
        SVar3 = 0;
        (*p_Var1)(v,"%s",local_18);
      }
    }
  }
  return SVar3;
}

Assistant:

static SQInteger base_print(HSQUIRRELVM v)
{
    const SQChar *str;
    if(SQ_SUCCEEDED(sq_tostring(v,2)))
    {
        if(SQ_SUCCEEDED(sq_getstring(v,-1,&str))) {
            if(_ss(v)->_printfunc) _ss(v)->_printfunc(v,_SC("%s"),str);
            return 0;
        }
    }
    return SQ_ERROR;
}